

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall TPZFMatrix<float>::TPZFMatrix(TPZFMatrix<float> *this,void **vtt)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffd8;
  TPZManVector<int,_5> *in_stack_ffffffffffffffe0;
  
  TPZMatrix<float>::TPZMatrix
            ((TPZMatrix<float> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0,
             (int64_t)in_RDI);
  *in_RDI = *in_RSI;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffffe0,(int64_t)(in_RDI + 7));
  TPZVec<float>::TPZVec((TPZVec<float> *)(in_RDI + 0xe));
  return;
}

Assistant:

TPZFMatrix() : TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),
    TPZMatrix<TVar>( 0, 0 ), fElem(0),fGiven(0),fSize(0) {}